

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

void __thiscall Alice::ObliviousExecute(Alice *this)

{
  long *plVar1;
  pointer pvVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  Message MVar9;
  Message local_78;
  string local_68;
  double local_48;
  double local_40;
  allocator local_31;
  
  if (ObliviousExecute()::fout == '\0') {
    iVar3 = __cxa_guard_acquire(&ObliviousExecute()::fout);
    if (iVar3 != 0) {
      std::ofstream::ofstream(ObliviousExecute()::fout,"../debug/alice/Debug_A.txt",_S_out);
      __cxa_atexit(std::ofstream::~ofstream,ObliviousExecute()::fout,&__dso_handle);
      __cxa_guard_release(&ObliviousExecute()::fout);
    }
  }
  poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: Oblivious Execute Run # ");
  iVar3 = ObliviousExecute::count;
  ObliviousExecute::count = ObliviousExecute::count + 1;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: pc = ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::operator<<(poVar4,"\n");
  plVar1 = (this->super_Party).P.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(this->super_Party).pc].
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  local_78.scalar1 = *plVar1;
  local_78.scalar2 = plVar1[1];
  Server::Send(this->srv,&local_78);
  poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: Msg sent to Bob : ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::operator<<(poVar4,"\n");
  MVar9 = Server::Receive(this->srv);
  poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: Msg rcvd from Bob: ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::operator<<(poVar4,"\n");
  plVar1 = (this->super_Party).P.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(this->super_Party).pc].
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  uVar8 = MVar9.scalar1 + *plVar1;
  uVar6 = MVar9.scalar2 + plVar1[1];
  poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: a = ");
  iVar7 = (int)uVar8;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
  poVar4 = std::operator<<(poVar4," b = ");
  iVar3 = (int)uVar6;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::operator<<(poVar4,"\n");
  if (((iVar7 < 0) || (iVar3 < 0)) || (iVar7 == 0 && iVar3 == 0)) {
    (this->super_Party).termination_condition = true;
  }
  else {
    uVar8 = uVar8 & 0x7fffffff;
    pvVar2 = (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar1 = pvVar2[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = *plVar1 - *pvVar2[uVar6 & 0x7fffffff].super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    *plVar1 = lVar5;
    (this->super_Party).output = lVar5;
    std::__cxx11::string::string((string *)&local_68,">=",&local_31);
    lVar5 = ObliviousComparison(this,&local_68,0,
                                *(this->super_Party).D.
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&local_68);
    poVar4 = std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: OC output  beta\' = ");
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    std::operator<<(poVar4,"\n");
    local_48 = ObliviousMultiplication
                         (this,lVar5,
                          *(long *)(*(long *)&(this->super_Party).P.
                                              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(this->super_Party).pc].
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data + 0x10));
    std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: OM output beta\'* P\'[pc][2] : ");
    poVar4 = std::ostream::_M_insert<double>(local_48);
    std::operator<<(poVar4,"\n");
    local_40 = ObliviousMultiplication
                         (this,1 - lVar5,
                          *(long *)(*(long *)&(this->super_Party).P.
                                              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(this->super_Party).pc].
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data + 0x18));
    std::operator<<((ostream *)ObliviousExecute()::fout,"Alice: OM output (1-beta\')(P\'[pc][3]) : "
                   );
    poVar4 = std::ostream::_M_insert<double>(local_40);
    std::operator<<(poVar4,"\n");
    (this->super_Party).pc = (long)(local_48 + local_40);
  }
  return;
}

Assistant:

void Alice::ObliviousExecute()
{
    static std::ofstream fout("../debug/alice/Debug_A.txt");
    static int count = 0;
    fout<<"Alice: Oblivious Execute Run # "<<count++<<"\n";
    fout<<"Alice: pc = "<<pc<<"\n";
    /*------- Step 1 -------*/
    Message msg_for_Bob, msg_from_Bob;
    msg_for_Bob.scalar1 = P[pc][0];
    msg_for_Bob.scalar2 = P[pc][1];
    srv->Send(msg_for_Bob);
    fout<<"Alice: Msg sent to Bob : "<<msg_for_Bob.scalar1 << " "<<msg_for_Bob.scalar2<<"\n";
    msg_from_Bob = srv->Receive();
    fout<<"Alice: Msg rcvd from Bob: "<<msg_from_Bob.scalar1<<" "<<msg_from_Bob.scalar2<<"\n";
    /*------- Step 2 -------*/
    int a = P[pc][0] + msg_from_Bob.scalar1;
    int b = P[pc][1] + msg_from_Bob.scalar2;
    fout<<"Alice: a = "<<a<<" b = "<<b<<"\n";
    if(a<0 || b<0||(a==0 && b==0)){
        termination_condition = true;
        return;
    }
    /*------- Step 3 -------*/
    D[a][0] = D[a][0] - D[b][0];
    output = D[a][0];
    /*------- Step 4 -------*/
    long beta = ObliviousComparison(">=", 0, D[a][0]);
    fout<<"Alice: OC output  beta' = "<<beta<<"\n";
    /*------- Step 5 -------*/
    double next_pc = ObliviousMultiplication(beta, P[pc][2]);
    fout<< "Alice: OM output beta'* P'[pc][2] : "<<next_pc<<"\n";
    double temp = ObliviousMultiplication(1-beta, P[pc][3]);
    fout<< "Alice: OM output (1-beta')(P'[pc][3]) : "<<temp<<"\n";
    pc = next_pc+temp;    
}